

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O0

void stbi__jpeg_reset(stbi__jpeg *j)

{
  int local_14;
  stbi__jpeg *j_local;
  
  j->code_bits = 0;
  j->code_buffer = 0;
  j->nomore = 0;
  j->img_comp[3].dc_pred = 0;
  j->img_comp[2].dc_pred = 0;
  j->img_comp[1].dc_pred = 0;
  j->img_comp[0].dc_pred = 0;
  j->marker = 0xff;
  if (j->restart_interval == 0) {
    local_14 = 0x7fffffff;
  }
  else {
    local_14 = j->restart_interval;
  }
  j->todo = local_14;
  j->eob_run = 0;
  return;
}

Assistant:

static void stbi__jpeg_reset(stbi__jpeg *j)
{
   j->code_bits = 0;
   j->code_buffer = 0;
   j->nomore = 0;
   j->img_comp[0].dc_pred = j->img_comp[1].dc_pred = j->img_comp[2].dc_pred = j->img_comp[3].dc_pred = 0;
   j->marker = STBI__MARKER_none;
   j->todo = j->restart_interval ? j->restart_interval : 0x7fffffff;
   j->eob_run = 0;
   // no more than 1<<31 MCUs if no restart_interal? that's plenty safe,
   // since we don't even allow 1<<30 pixels
}